

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::GrammarResolver::containsNameSpace(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Grammar *grammar;
  Janitor<xercesc_4_0::XMLGrammarDescription> janName;
  XMLSchemaDescription *gramDesc;
  XMLCh *nameSpaceKey_local;
  GrammarResolver *this_local;
  
  if (nameSpaceKey == (XMLCh *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                      (this->fGrammarBucket,nameSpaceKey);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      if ((this->fUseCachedGrammar & 1U) != 0) {
        bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                          (this->fGrammarFromPool,nameSpaceKey);
        if (bVar1) {
          this_local._7_1_ = 1;
          goto LAB_003cec0b;
        }
        iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xc])(this->fGrammarPool,nameSpaceKey);
        janName.fData = (XMLGrammarDescription *)CONCAT44(extraout_var,iVar2);
        Janitor<xercesc_4_0::XMLGrammarDescription>::Janitor
                  ((Janitor<xercesc_4_0::XMLGrammarDescription> *)&grammar,janName.fData);
        iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[3])(this->fGrammarPool,janName.fData);
        bVar1 = CONCAT44(extraout_var_00,iVar2) != 0;
        if (bVar1) {
          this_local._7_1_ = 1;
        }
        Janitor<xercesc_4_0::XMLGrammarDescription>::~Janitor
                  ((Janitor<xercesc_4_0::XMLGrammarDescription> *)&grammar);
        if (bVar1) goto LAB_003cec0b;
      }
      this_local._7_1_ = 0;
    }
  }
LAB_003cec0b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GrammarResolver::containsNameSpace( const XMLCh* const nameSpaceKey )
{
    if (!nameSpaceKey)
        return false;
    if (fGrammarBucket->containsKey(nameSpaceKey))
        return true;
    if (fUseCachedGrammar)
    {
        if (fGrammarFromPool->containsKey(nameSpaceKey))
            return true;

        // Lastly, need to check in fGrammarPool        
        XMLSchemaDescription* gramDesc = fGrammarPool->createSchemaDescription(nameSpaceKey);
        Janitor<XMLGrammarDescription> janName(gramDesc);
        Grammar* grammar = fGrammarPool->retrieveGrammar(gramDesc);
        if (grammar)
            return true;
    }

    return false;
}